

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_bin.c
# Opt level: O1

void duckdb_je_cache_bin_init
               (cache_bin_t *bin,cache_bin_info_t *info,void *alloc,size_t *cur_offset)

{
  size_t sVar1;
  ushort uVar2;
  size_t sVar3;
  uint16_t uVar4;
  void **ppvVar5;
  
  sVar3 = *cur_offset;
  uVar2 = info->ncached_max;
  sVar1 = sVar3 + (ulong)(uVar2 & 0x1fff) * 8;
  *cur_offset = sVar1;
  ppvVar5 = (void **)((long)alloc + sVar1);
  bin->stack_head = ppvVar5;
  uVar4 = (uint16_t)ppvVar5;
  bin->low_bits_low_water = uVar4;
  bin->low_bits_full = (short)sVar3 + (short)alloc;
  bin->low_bits_empty = uVar4;
  (bin->bin_info).ncached_max = uVar2;
  return;
}

Assistant:

void
cache_bin_init(cache_bin_t *bin, const cache_bin_info_t *info, void *alloc,
    size_t *cur_offset) {
	/*
	 * The full_position points to the lowest available space.  Allocations
	 * will access the slots toward higher addresses (for the benefit of
	 * adjacent prefetch).
	 */
	void *stack_cur = (void *)((byte_t *)alloc + *cur_offset);
	void *full_position = stack_cur;
	uint16_t bin_stack_size = info->ncached_max * sizeof(void *);

	*cur_offset += bin_stack_size;
	void *empty_position = (void *)((byte_t *)alloc + *cur_offset);

	/* Init to the empty position. */
	bin->stack_head = (void **)empty_position;
	bin->low_bits_low_water = (uint16_t)(uintptr_t)bin->stack_head;
	bin->low_bits_full = (uint16_t)(uintptr_t)full_position;
	bin->low_bits_empty = (uint16_t)(uintptr_t)empty_position;
	cache_bin_info_init(&bin->bin_info, info->ncached_max);
	cache_bin_sz_t free_spots = cache_bin_diff(bin,
	    bin->low_bits_full, (uint16_t)(uintptr_t)bin->stack_head);
	assert(free_spots == bin_stack_size);
	if (!cache_bin_disabled(bin)) {
		assert(cache_bin_ncached_get_local(bin) == 0);
	}
	assert(cache_bin_empty_position_get(bin) == empty_position);

	assert(bin_stack_size > 0 || empty_position == full_position);
}